

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

AdjustResult __thiscall
QTextCursorPrivate::adjustPosition
          (QTextCursorPrivate *this,int positionOfChange,int charsAddedOrRemoved,Operation op)

{
  int iVar1;
  int iVar2;
  AdjustResult AVar3;
  
  iVar1 = this->position;
  AVar3 = CursorUnchanged;
  if ((positionOfChange <= iVar1) &&
     ((iVar1 != positionOfChange || ((op != KeepCursor && ((this->field_0x28 & 2) == 0)))))) {
    iVar2 = iVar1 + charsAddedOrRemoved;
    if (iVar1 < positionOfChange - charsAddedOrRemoved) {
      iVar2 = positionOfChange;
    }
    if (-1 < charsAddedOrRemoved) {
      iVar2 = iVar1 + charsAddedOrRemoved;
    }
    this->position = iVar2;
    this->currentCharFormat = -1;
    AVar3 = CursorMoved;
  }
  iVar1 = this->anchor;
  if ((positionOfChange <= iVar1) && (iVar1 != positionOfChange || op != KeepCursor)) {
    iVar2 = iVar1 + charsAddedOrRemoved;
    if (iVar1 < positionOfChange - charsAddedOrRemoved) {
      iVar2 = positionOfChange;
    }
    if (-1 < charsAddedOrRemoved) {
      iVar2 = iVar1 + charsAddedOrRemoved;
    }
    this->anchor = iVar2;
  }
  iVar1 = this->adjusted_anchor;
  if ((positionOfChange <= iVar1) && (op != KeepCursor || iVar1 != positionOfChange)) {
    if (positionOfChange - charsAddedOrRemoved <= iVar1) {
      positionOfChange = iVar1 + charsAddedOrRemoved;
    }
    if (-1 < charsAddedOrRemoved) {
      positionOfChange = iVar1 + charsAddedOrRemoved;
    }
    this->adjusted_anchor = positionOfChange;
  }
  return AVar3;
}

Assistant:

QTextCursorPrivate::AdjustResult QTextCursorPrivate::adjustPosition(int positionOfChange, int charsAddedOrRemoved, QTextUndoCommand::Operation op)
{
    QTextCursorPrivate::AdjustResult result = QTextCursorPrivate::CursorMoved;
    // not(!) <= , so that inserting text adjusts the cursor correctly
    if (position < positionOfChange
        || (position == positionOfChange
            && (op == QTextUndoCommand::KeepCursor
                || keepPositionOnInsert)
            )
         ) {
        result = CursorUnchanged;
    } else {
        if (charsAddedOrRemoved < 0 && position < positionOfChange - charsAddedOrRemoved)
            position = positionOfChange;
        else
            position += charsAddedOrRemoved;

        currentCharFormat = -1;
    }

    if (anchor >= positionOfChange
        && (anchor != positionOfChange || op != QTextUndoCommand::KeepCursor)) {
        if (charsAddedOrRemoved < 0 && anchor < positionOfChange - charsAddedOrRemoved)
            anchor = positionOfChange;
        else
            anchor += charsAddedOrRemoved;
    }

    if (adjusted_anchor >= positionOfChange
        && (adjusted_anchor != positionOfChange || op != QTextUndoCommand::KeepCursor)) {
        if (charsAddedOrRemoved < 0 && adjusted_anchor < positionOfChange - charsAddedOrRemoved)
            adjusted_anchor = positionOfChange;
        else
            adjusted_anchor += charsAddedOrRemoved;
    }

    return result;
}